

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NumberPragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token base;
  Token size;
  NumberPragmaExpressionSyntax *pNVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  Token *in_RSI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pNVar1 = (NumberPragmaExpressionSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  size.info = (Info *)*in_RDX;
  size._0_8_ = (NumberPragmaExpressionSyntax *)in_RCX[1];
  base.info = (Info *)*in_RCX;
  base._0_8_ = pNVar1;
  slang::syntax::NumberPragmaExpressionSyntax::NumberPragmaExpressionSyntax
            ((NumberPragmaExpressionSyntax *)in_RCX[1],size,base,*in_RSI);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }